

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode singleipconnect(Curl_easy *data,connectdata *conn,Curl_addrinfo *ai,int tempindex)

{
  undefined1 *puVar1;
  uchar uVar2;
  curl_socket_t __fd;
  socklen_t sVar3;
  _Bool _Var4;
  uchar uVar5;
  CURLcode CVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  if2ip_result_t iVar10;
  int *piVar11;
  ulong uVar12;
  undefined8 extraout_RAX;
  size_t sVar13;
  uint *puVar14;
  uint uVar15;
  char *pcVar16;
  ushort uVar17;
  uint uVar18;
  long lVar19;
  byte *__s;
  connectdata *pcVar20;
  char *__nptr;
  curltime cVar21;
  socklen_t local_338;
  curl_socket_t sockfd;
  int local_32c;
  uint local_328;
  undefined4 local_324;
  long local_320;
  Curl_dns_entry *h;
  connectdata *local_310;
  int optval;
  int port;
  int on;
  curl_socklen_t size;
  curl_socklen_t onoff;
  undefined1 auStack_2f4 [4];
  char acStack_2f0 [16];
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  char ipaddress [46];
  char buffer [256];
  Curl_sockaddr_ex addr;
  Curl_sockaddr_storage add;
  
  optval = 1;
  lVar19 = (long)tempindex;
  conn->tempsock[lVar19] = -1;
  CVar6 = Curl_socket(data,ai,&addr,&sockfd);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  _Var4 = Curl_addr2string(&addr._sa_ex_u.addr,addr.addrlen,ipaddress,&port);
  if (!_Var4) {
    puVar14 = (uint *)__errno_location();
    uVar15 = *puVar14;
    pcVar16 = Curl_strerror(uVar15,buffer,0x100);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar15,pcVar16);
    Curl_closesocket(data,conn,sockfd);
    return CURLE_OK;
  }
  pcVar16 = "  Trying %s:%d...";
  if (addr.family == 10) {
    pcVar16 = "  Trying [%s]:%d...";
  }
  Curl_infof(data,pcVar16,ipaddress,(ulong)(uint)port);
  if (((addr.family & 0xfffffff7U) == 2) && (addr.socktype == 1)) {
    uVar12 = *(ulong *)&(data->set).field_0x8e2;
    if ((uVar12 >> 0x20 & 1) != 0) {
      onoff = 1;
      iVar7 = setsockopt(sockfd,6,1,&onoff,4);
      if (iVar7 < 0) {
        piVar11 = __errno_location();
        pcVar16 = Curl_strerror(*piVar11,buffer,0x100);
        Curl_infof(data,"Could not set TCP_NODELAY: %s",pcVar16);
      }
      uVar12 = *(ulong *)&(data->set).field_0x8e2;
    }
    __fd = sockfd;
    if ((uVar12 >> 0x26 & 1) != 0) {
      buffer[0] = '\x01';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      iVar7 = setsockopt(sockfd,1,9,buffer,4);
      if (iVar7 < 0) {
        pcVar16 = "Failed to set SO_KEEPALIVE on fd %d";
      }
      else {
        buffer._0_4_ = curlx_sltosi((long)(data->set).tcp_keepidle);
        iVar7 = setsockopt(__fd,6,4,buffer,4);
        if (iVar7 < 0) {
          Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d",(ulong)(uint)__fd);
        }
        buffer._0_4_ = curlx_sltosi((long)(data->set).tcp_keepintvl);
        iVar7 = setsockopt(__fd,6,5,buffer,4);
        if (-1 < iVar7) goto LAB_00454a70;
        pcVar16 = "Failed to set TCP_KEEPINTVL on fd %d";
      }
      Curl_infof(data,pcVar16,(ulong)(uint)__fd);
    }
  }
LAB_00454a70:
  if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
    local_324 = 0;
    uVar15 = sockfd;
  }
  else {
    Curl_set_in_callback(data,true);
    uVar15 = sockfd;
    iVar7 = (*(data->set).fsockopt)((data->set).sockopt_client,sockfd,CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data,false);
    if (iVar7 == 0) {
      local_324 = 0;
    }
    else {
      if (iVar7 != 2) {
        Curl_closesocket(data,conn,uVar15);
        return CURLE_ABORTED_BY_CALLBACK;
      }
      local_324 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
  }
  if ((addr.family & 0xfffffff7U) != 2) goto LAB_00454c00;
  local_320 = lVar19;
  uVar8 = Curl_ipv6_scope(&addr._sa_ex_u.addr);
  pcVar20 = data->conn;
  h = (Curl_dns_entry *)0x0;
  uVar17 = (data->set).localport;
  local_32c = (data->set).localportrange;
  __s = (byte *)(data->set).str[8];
  on = 1;
  lVar19 = local_320;
  if (uVar17 == 0 && __s == (byte *)0x0) goto LAB_00454c00;
  local_288 = 0;
  uStack_280 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  acStack_2f0[8] = '\0';
  acStack_2f0[9] = '\0';
  acStack_2f0[10] = '\0';
  acStack_2f0[0xb] = '\0';
  acStack_2f0[0xc] = '\0';
  acStack_2f0[0xd] = '\0';
  acStack_2f0[0xe] = '\0';
  acStack_2f0[0xf] = '\0';
  uStack_2e0 = 0;
  onoff._0_2_ = 0;
  onoff._2_1_ = '\0';
  onoff._3_1_ = '\0';
  auStack_2f4[0] = '\0';
  auStack_2f4[1] = '\0';
  auStack_2f4[2] = '\0';
  auStack_2f4[3] = '\0';
  acStack_2f0[0] = '\0';
  acStack_2f0[1] = '\0';
  acStack_2f0[2] = '\0';
  acStack_2f0[3] = '\0';
  acStack_2f0[4] = '\0';
  acStack_2f0[5] = '\0';
  acStack_2f0[6] = '\0';
  acStack_2f0[7] = '\0';
  local_310 = pcVar20;
  if ((__s == (byte *)0x0) || (sVar13 = strlen((char *)__s), 0xfe < sVar13)) {
    iVar7 = local_32c;
    if (addr.family == 2) {
      onoff = CONCAT22(uVar17 << 8 | uVar17 >> 8,2);
      sVar3 = 0x10;
    }
    else {
      local_338 = 0;
      sVar3 = local_338;
      if (addr.family == 10) {
        onoff = CONCAT22(uVar17 << 8 | uVar17 >> 8,10);
        sVar3 = 0x1c;
      }
    }
LAB_00454ff5:
    local_338 = sVar3;
    setsockopt(uVar15,0,0x18,&on,4);
    uVar8 = (uint)uVar17;
    while( true ) {
      uVar18 = uVar8 + 1;
      iVar9 = bind(uVar15,(sockaddr *)&onoff,local_338);
      if (-1 < iVar9) break;
      if ((iVar7 < 2) || (uVar17 = (ushort)uVar18, uVar17 == 0)) {
        puVar14 = (uint *)__errno_location();
        uVar15 = *puVar14;
        (data->state).os_errno = uVar15;
        pcVar16 = Curl_strerror(uVar15,buffer,0x100);
        Curl_failf(data,"bind failed with errno %d: %s",(ulong)uVar15,pcVar16);
        iVar10 = 0x2d;
        goto LAB_00455164;
      }
      Curl_infof(data,"Bind to local port %hu failed, trying next",(ulong)((uVar18 & 0xffff) - 1));
      onoff = CONCAT22(uVar17 << 8 | uVar17 >> 8,(sa_family_t)onoff);
      iVar7 = iVar7 + -1;
      uVar8 = uVar18;
    }
    size = 0x80;
    add.buffer._0_8_ = 0;
    add.buffer._8_1_ = '\0';
    add.buffer._9_1_ = '\0';
    add.buffer._10_1_ = '\0';
    add.buffer._11_1_ = '\0';
    add.buffer._12_1_ = '\0';
    add.buffer._13_1_ = '\0';
    add.buffer._14_1_ = '\0';
    add.buffer._15_1_ = '\0';
    add.buffer._16_8_ = 0;
    add.buffer._24_8_ = 0;
    add.buffer._32_8_ = 0;
    add.buffer._40_8_ = 0;
    add.buffer._48_8_ = 0;
    add.buffer._56_8_ = 0;
    add.buffer._64_8_ = 0;
    add.buffer._72_8_ = 0;
    add.buffer._80_8_ = 0;
    add.buffer._88_8_ = 0;
    add.buffer._96_8_ = 0;
    add.buffer._104_8_ = 0;
    add.buffer._112_8_ = 0;
    add.buffer.sa_stor.__ss_align = 0;
    iVar7 = getsockname(uVar15,(sockaddr *)&add,&size);
    if (iVar7 < 0) {
      puVar14 = (uint *)__errno_location();
      uVar15 = *puVar14;
      (data->state).os_errno = uVar15;
      pcVar16 = Curl_strerror(uVar15,buffer,0x100);
      Curl_failf(data,"getsockname() failed with errno %d: %s",(ulong)uVar15,pcVar16);
      goto LAB_0045514e;
    }
    iVar10 = IF2IP_NOT_FOUND;
    Curl_infof(data,"Local port: %hu",(ulong)uVar8);
    puVar1 = &(local_310->bits).field_0x6;
    *puVar1 = *puVar1 | 0x80;
  }
  else {
    local_328 = uVar15;
    memset(buffer,0,0x100);
    iVar7 = *__s - 0x69;
    if ((iVar7 == 0) && (iVar7 = __s[1] - 0x66, iVar7 == 0)) {
      iVar7 = 0x21 - (uint)__s[2];
    }
    else {
      iVar7 = -iVar7;
    }
    if (iVar7 != 0) {
      iVar9 = strncmp("host!",(char *)__s,5);
      if (iVar9 != 0) goto LAB_00454dae;
      __s = __s + 5;
      goto LAB_00454e57;
    }
    __s = __s + 3;
LAB_00454dae:
    sVar13 = strlen((char *)__s);
    iVar9 = setsockopt(local_328,1,0x19,__s,(int)sVar13 + 1);
    if (iVar9 == 0) {
      iVar10 = IF2IP_NOT_FOUND;
      goto LAB_00455152;
    }
    iVar10 = Curl_if2ip(addr.family,uVar8,pcVar20->scope_id,(char *)__s,buffer,0x100);
    if (iVar10 == IF2IP_FOUND) {
      Curl_infof(data,"Local Interface %s is ip %s using address family %i",__s,buffer,
                 (ulong)(uint)addr.family);
LAB_00454f01:
      iVar7 = local_32c;
      local_338 = 0;
      sVar3 = local_338;
      if (addr.family == 2) {
        iVar9 = inet_pton(2,buffer,auStack_2f4);
        uVar15 = local_328;
        iVar7 = local_32c;
        if (0 < iVar9) {
          onoff = CONCAT22(uVar17 << 8 | uVar17 >> 8,2);
          local_338 = 0x10;
          sVar3 = local_338;
        }
      }
      else {
        uVar15 = local_328;
        if (addr.family == 10) {
          pcVar16 = strchr(buffer,0x25);
          if (pcVar16 == (char *)0x0) {
            __nptr = (char *)0x0;
          }
          else {
            __nptr = pcVar16 + 1;
            *pcVar16 = '\0';
          }
          iVar9 = inet_pton(10,buffer,acStack_2f0);
          local_338 = 0x1c;
          sVar3 = 0x1c;
          if (0 < iVar9) {
            onoff = CONCAT22(uVar17 << 8 | uVar17 >> 8,10);
            if (__nptr != (char *)0x0) {
              iVar9 = atoi(__nptr);
              uStack_2e0 = CONCAT44(uStack_2e0._4_4_,iVar9);
              sVar3 = local_338;
            }
          }
        }
      }
      goto LAB_00454ff5;
    }
    if (iVar10 == IF2IP_AF_NOT_SUPPORTED) goto LAB_00455152;
    pcVar20 = local_310;
    if (iVar10 == IF2IP_NOT_FOUND) {
      if (iVar7 != 0) {
LAB_00454e57:
        uVar2 = pcVar20->ip_version;
        if (addr.family == 2) {
          uVar5 = '\x01';
LAB_00454e73:
          pcVar20->ip_version = uVar5;
        }
        else if (addr.family == 10) {
          uVar5 = '\x02';
          goto LAB_00454e73;
        }
        Curl_resolv(data,(char *)__s,0,false,&h);
        pcVar20->ip_version = uVar2;
        if (h != (Curl_dns_entry *)0x0) {
          Curl_printable_address(h->addr,buffer,0x100);
          Curl_infof(data,"Name \'%s\' family %i resolved to \'%s\' family %i",__s,
                     (ulong)(uint)addr.family,buffer,(ulong)(uint)h->addr->ai_family);
          Curl_resolv_unlock(data,h);
          if (h->addr->ai_family != addr.family) {
            iVar10 = IF2IP_AF_NOT_SUPPORTED;
            goto LAB_00455152;
          }
          goto LAB_00454f01;
        }
        goto LAB_00454f41;
      }
      pcVar16 = "Couldn\'t bind to interface \'%s\'";
    }
    else {
      if (iVar7 != 0) goto LAB_00454e57;
LAB_00454f41:
      puVar1 = &(data->state).field_0x6d0;
      *puVar1 = *puVar1 & 0xf7;
      pcVar16 = "Couldn\'t bind to \'%s\'";
    }
    Curl_failf(data,pcVar16,__s);
LAB_0045514e:
    iVar10 = 0x2d;
  }
LAB_00455152:
  lVar19 = local_320;
  uVar15 = sockfd;
  if (iVar10 != IF2IP_NOT_FOUND) {
LAB_00455164:
    Curl_closesocket(data,conn,sockfd);
    if (iVar10 == IF2IP_AF_NOT_SUPPORTED) {
      return CURLE_COULDNT_CONNECT;
    }
    return iVar10;
  }
LAB_00454c00:
  curlx_nonblock(uVar15,1);
  cVar21 = Curl_now();
  (conn->connecttime).tv_sec = cVar21.tv_sec;
  (conn->connecttime).tv_usec = cVar21.tv_usec;
  if (1 < conn->num_addr) {
    Curl_expire(data,conn->timeoutms_per_addr[0],EXPIRE_DNS_PER_NAME);
    Curl_expire(data,conn->timeoutms_per_addr[1],EXPIRE_DNS_PER_NAME2);
  }
  if (((char)local_324 == '\0') && (conn->transport != '\x04')) {
    if ((((conn->bits).field_0x7 & 2) != 0) &&
       (iVar7 = setsockopt(uVar15,6,0x1e,&optval,4), iVar7 < 0)) {
      Curl_infof(data,"Failed to enable TCP Fast Open on fd %d",(ulong)uVar15);
    }
    iVar7 = connect(uVar15,(sockaddr *)&addr._sa_ex_u.addr,addr.addrlen);
    if (iVar7 == -1) {
      piVar11 = __errno_location();
      iVar7 = *piVar11;
      if ((iVar7 != 0xb) && (iVar7 != 0x73)) {
        pcVar16 = Curl_strerror(iVar7,buffer,0x100);
        Curl_infof(data,"Immediate connect fail for %s: %s",ipaddress,pcVar16);
        (data->state).os_errno = iVar7;
        Curl_closesocket(data,conn,uVar15);
        return CURLE_COULDNT_CONNECT;
      }
    }
    conn->tempsock[lVar19] = uVar15;
  }
  else {
    conn->tempsock[lVar19] = uVar15;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode singleipconnect(struct Curl_easy *data,
                                struct connectdata *conn,
                                const struct Curl_addrinfo *ai,
                                int tempindex)
{
  struct Curl_sockaddr_ex addr;
  int rc = -1;
  int error = 0;
  bool isconnected = FALSE;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  int port;
  bool is_tcp;
#ifdef TCP_FASTOPEN_CONNECT
  int optval = 1;
#endif
  const char *ipmsg;
  char buffer[STRERROR_LEN];
  curl_socket_t *sockp = &conn->tempsock[tempindex];
  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(data, ai, &addr, &sockfd);
  if(result)
    return result;

  /* store remote address and port used in this connection attempt */
  if(!Curl_addr2string((struct sockaddr*)&addr.sa_addr, addr.addrlen,
                       ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          errno, Curl_strerror(errno, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, sockfd);
    return CURLE_OK;
  }
#ifdef ENABLE_IPV6
  if(addr.family == AF_INET6)
    ipmsg = "  Trying [%s]:%d...";
  else
#endif
    ipmsg = "  Trying %s:%d...";
  infof(data, ipmsg, ipaddress, port);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(data, sockfd);

  nosigpipe(data, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    Curl_set_in_callback(data, true);
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);
    Curl_set_in_callback(data, false);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(data, conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(data, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(data, conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_now();
  if(conn->num_addr > 1) {
    Curl_expire(data, conn->timeoutms_per_addr[0], EXPIRE_DNS_PER_NAME);
    Curl_expire(data, conn->timeoutms_per_addr[1], EXPIRE_DNS_PER_NAME2);
  }

  /* Connect TCP and QUIC sockets */
  if(!isconnected && (conn->transport != TRNSPRT_UDP)) {
    if(conn->bits.tcp_fastopen) {
#if defined(CONNECT_DATA_IDEMPOTENT) /* Darwin */
#  if defined(HAVE_BUILTIN_AVAILABLE)
      /* while connectx function is available since macOS 10.11 / iOS 9,
         it did not have the interface declared correctly until
         Xcode 9 / macOS SDK 10.13 */
      if(__builtin_available(macOS 10.11, iOS 9.0, tvOS 9.0, watchOS 2.0, *)) {
        sa_endpoints_t endpoints;
        endpoints.sae_srcif = 0;
        endpoints.sae_srcaddr = NULL;
        endpoints.sae_srcaddrlen = 0;
        endpoints.sae_dstaddr = &addr.sa_addr;
        endpoints.sae_dstaddrlen = addr.addrlen;

        rc = connectx(sockfd, &endpoints, SAE_ASSOCID_ANY,
                      CONNECT_RESUME_ON_READ_WRITE | CONNECT_DATA_IDEMPOTENT,
                      NULL, 0, NULL, NULL);
      }
      else {
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      }
#  else
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#  endif /* HAVE_BUILTIN_AVAILABLE */
#elif defined(TCP_FASTOPEN_CONNECT) /* Linux >= 4.11 */
      if(setsockopt(sockfd, IPPROTO_TCP, TCP_FASTOPEN_CONNECT,
                    (void *)&optval, sizeof(optval)) < 0)
        infof(data, "Failed to enable TCP Fast Open on fd %d", sockfd);

      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
#elif defined(MSG_FASTOPEN) /* old Linux */
      if(conn->given->flags & PROTOPT_SSL)
        rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
      else
        rc = 0; /* Do nothing */
#endif
    }
    else {
      rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    }

    if(-1 == rc)
      error = SOCKERRNO;
#ifdef ENABLE_QUIC
    else if(conn->transport == TRNSPRT_QUIC) {
      /* pass in 'sockfd' separately since it hasn't been put into the
         tempsock array at this point */
      result = Curl_quic_connect(data, conn, sockfd, tempindex,
                                 &addr.sa_addr, addr.addrlen);
      if(result)
        error = SOCKERRNO;
    }
#endif
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s",
            ipaddress, Curl_strerror(error, buffer, sizeof(buffer)));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(data, conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}